

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Sequence(Vector *this,int64_t start,int64_t increment,idx_t count)

{
  int64_t *piVar1;
  VectorBuffer *pVVar2;
  shared_ptr<duckdb::VectorBuffer,_true> local_40;
  
  this->vector_type = SEQUENCE_VECTOR;
  make_shared_ptr<duckdb::VectorBuffer,unsigned_long>((unsigned_long *)&local_40);
  shared_ptr<duckdb::VectorBuffer,_true>::operator=(&this->buffer,&local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pVVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
  piVar1 = (int64_t *)(pVVar2->data).pointer;
  *piVar1 = start;
  piVar1[1] = increment;
  piVar1[2] = count;
  TemplatedValidityMask<unsigned_long>::Reset
            (&(this->validity).super_TemplatedValidityMask<unsigned_long>,0x800);
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&this->auxiliary);
  return;
}

Assistant:

void Vector::Sequence(int64_t start, int64_t increment, idx_t count) {
	this->vector_type = VectorType::SEQUENCE_VECTOR;
	this->buffer = make_buffer<VectorBuffer>(sizeof(int64_t) * 3);
	auto data = reinterpret_cast<int64_t *>(buffer->GetData());
	data[0] = start;
	data[1] = increment;
	data[2] = int64_t(count);
	validity.Reset();
	auxiliary.reset();
}